

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Metadata::SerializeWithCachedSizes(Metadata *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  InnerMap *pIVar3;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar4;
  value_type *key;
  scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  sVar5;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **ppMVar6;
  ulong uVar7;
  MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *pMVar8;
  MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *pMVar9;
  MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *pMVar10;
  long lVar11;
  long i;
  scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  items;
  const_iterator it;
  scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  local_70;
  iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  local_68;
  Metadata *local_50;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  local_48;
  
  psVar1 = (this->shortdescription_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.Metadata.shortDescription");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (1,(this->shortdescription_).ptr_,output);
  }
  psVar1 = (this->versionstring_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.Metadata.versionString");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (2,(this->versionstring_).ptr_,output);
  }
  psVar1 = (this->author_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.Metadata.author");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (3,(this->author_).ptr_,output);
  }
  psVar1 = (this->license_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.Metadata.license");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (4,(this->license_).ptr_,output);
  }
  pIVar3 = (this->userdefined_).map_.elements_;
  if (pIVar3->num_elements_ != 0) {
    uVar7 = google::protobuf::io::CodedOutputStream::default_serialization_deterministic_;
    if (output->serialization_deterministic_is_overridden_ != false) {
      uVar7 = (ulong)output->serialization_deterministic_override_;
    }
    local_48.m_ = pIVar3;
    if ((pIVar3->num_elements_ == 1) || (uVar7 == 0)) {
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::InnerMap::
      iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
      ::SearchFrom(&local_48,pIVar3->index_of_first_non_null_);
      local_68.node_ = (Node *)CONCAT44(local_48.node_._4_4_,local_48.node_._0_4_);
      local_68.m_ = local_48.m_;
      local_68.bucket_index_ = local_48.bucket_index_;
      pMVar10 = (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                 *)0x0;
      while (local_68.node_ != (Node *)0x0) {
        key = ((local_68.node_)->kv).v_;
        pMVar8 = google::protobuf::internal::
                 MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                 ::Wrap(&key->first,&key->second,(this->userdefined_).arena_);
        pMVar9 = pMVar10;
        if ((pMVar10 != pMVar8) &&
           (pMVar9 = pMVar8,
           pMVar10 !=
           (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
            *)0x0)) {
          (*(pMVar10->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
            ).super_MessageLite._vptr_MessageLite[1])(pMVar10);
        }
        if (pMVar9 == (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                       *)0x0) goto LAB_001faf39;
        google::protobuf::internal::WireFormatLite::WriteMessage(100,(MessageLite *)pMVar9,output);
        SerializeWithCachedSizes(google::protobuf::io::CodedOutputStream*)::string_>_const__
                  (((local_68.node_)->kv).v_);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InnerMap::
        iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
        ::operator++(&local_68);
        pMVar10 = pMVar9;
      }
      if (pMVar10 !=
          (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
           *)0x0) {
        (*(pMVar10->
          super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
          ).super_MessageLite._vptr_MessageLite[1])(pMVar10);
      }
    }
    else {
      local_70.array_ =
           (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            **)operator_new__(-(ulong)(pIVar3->num_elements_ >> 0x3d != 0) |
                              pIVar3->num_elements_ << 3);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::InnerMap::
      iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
      ::SearchFrom(&local_48,pIVar3->index_of_first_non_null_);
      local_68.node_ = (Node *)CONCAT44(local_48.node_._4_4_,local_48.node_._0_4_);
      local_68.m_ = local_48.m_;
      local_68.bucket_index_ = local_48.bucket_index_;
      i = 0;
      if (local_68.node_ != (Node *)0x0) {
        do {
          pMVar4 = ((local_68.node_)->kv).v_;
          ppMVar6 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                    ::operator[](&local_70,i);
          *ppMVar6 = pMVar4;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InnerMap::
          iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
          ::operator++(&local_68);
          i = i + 1;
        } while (local_68.node_ != (Node *)0x0);
      }
      sVar5.array_ = local_70.array_;
      if (local_70.array_ ==
          (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           **)0x0) {
        __assert_fail("array_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0xb3,
                      "C &google::protobuf::internal::scoped_array<const google::protobuf::MapPair<std::basic_string<char>, std::basic_string<char>> *>::operator[](std::ptrdiff_t) const [C = const google::protobuf::MapPair<std::basic_string<char>, std::basic_string<char>> *]"
                     );
      }
      ppMVar6 = google::protobuf::internal::
                scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                ::operator[](&local_70,i);
      if (sVar5.array_ != ppMVar6) {
        uVar7 = (long)ppMVar6 - (long)sVar5.array_ >> 3;
        lVar11 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        std::
        __introsort_loop<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*>>>
                  (sVar5.array_,ppMVar6,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*>>>
                  (sVar5.array_,ppMVar6);
      }
      if (i == 0) {
        pMVar10 = (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                   *)0x0;
      }
      else {
        lVar11 = 0;
        pMVar9 = (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                  *)0x0;
        local_50 = this;
        do {
          ppMVar6 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                    ::operator[](&local_70,lVar11);
          pMVar4 = *ppMVar6;
          ppMVar6 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                    ::operator[](&local_70,lVar11);
          pMVar8 = google::protobuf::internal::
                   MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                   ::Wrap(&pMVar4->first,&(*ppMVar6)->second,(local_50->userdefined_).arena_);
          pMVar10 = pMVar9;
          if ((pMVar9 != pMVar8) &&
             (pMVar10 = pMVar8,
             pMVar9 != (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
                        *)0x0)) {
            (*(pMVar9->
              super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
              ).super_MessageLite._vptr_MessageLite[1])(pMVar9);
          }
          if (pMVar10 ==
              (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
               *)0x0) {
LAB_001faf39:
            __assert_fail("ptr_ != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                          ,0x5b,
                          "C &google::protobuf::internal::scoped_ptr<google::protobuf::internal::MapEntryLite<std::basic_string<char>, std::basic_string<char>, google::protobuf::internal::WireFormatLite::TYPE_STRING, google::protobuf::internal::WireFormatLite::TYPE_STRING, 0>>::operator*() const [C = google::protobuf::internal::MapEntryLite<std::basic_string<char>, std::basic_string<char>, google::protobuf::internal::WireFormatLite::TYPE_STRING, google::protobuf::internal::WireFormatLite::TYPE_STRING, 0>]"
                         );
          }
          google::protobuf::internal::WireFormatLite::WriteMessage
                    (100,(MessageLite *)pMVar10,output);
          ppMVar6 = google::protobuf::internal::
                    scoped_array<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                    ::operator[](&local_70,lVar11);
          SerializeWithCachedSizes(google::protobuf::io::CodedOutputStream*)::string_>_const__
                    (*ppMVar6);
          lVar11 = lVar11 + 1;
          pMVar9 = pMVar10;
        } while (i != lVar11);
      }
      if (pMVar10 !=
          (MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
           *)0x0) {
        (*(pMVar10->
          super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
          ).super_MessageLite._vptr_MessageLite[1])(pMVar10);
      }
      if (local_70.array_ !=
          (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           **)0x0) {
        operator_delete__(local_70.array_);
      }
    }
  }
  return;
}

Assistant:

void Metadata::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Metadata)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string shortDescription = 1;
  if (this->shortdescription().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->shortdescription().data(), this->shortdescription().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.shortDescription");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->shortdescription(), output);
  }

  // string versionString = 2;
  if (this->versionstring().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->versionstring().data(), this->versionstring().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.versionString");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->versionstring(), output);
  }

  // string author = 3;
  if (this->author().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->author().data(), this->author().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.author");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->author(), output);
  }

  // string license = 4;
  if (this->license().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->license().data(), this->license().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.license");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      4, this->license(), output);
  }

  // map<string, string> userDefined = 100;
  if (!this->userdefined().empty()) {
    typedef ::google::protobuf::Map< ::std::string, ::std::string >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::google::protobuf::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), p->first.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.key");
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->second.data(), p->second.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.value");
      }
    };

    if (output->IsSerializationDeterministic() &&
        this->userdefined().size() > 1) {
      ::google::protobuf::scoped_array<SortItem> items(
          new SortItem[this->userdefined().size()]);
      typedef ::google::protobuf::Map< ::std::string, ::std::string >::size_type size_type;
      size_type n = 0;
      for (::google::protobuf::Map< ::std::string, ::std::string >::const_iterator
          it = this->userdefined().begin();
          it != this->userdefined().end(); ++it, ++n) {
        items[n] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[n], Less());
      ::google::protobuf::scoped_ptr<Metadata_UserDefinedEntry> entry;
      for (size_type i = 0; i < n; i++) {
        entry.reset(userdefined_.NewEntryWrapper(
            items[i]->first, items[i]->second));
        ::google::protobuf::internal::WireFormatLite::WriteMessage(
            100, *entry, output);
        Utf8Check::Check(items[i]);
      }
    } else {
      ::google::protobuf::scoped_ptr<Metadata_UserDefinedEntry> entry;
      for (::google::protobuf::Map< ::std::string, ::std::string >::const_iterator
          it = this->userdefined().begin();
          it != this->userdefined().end(); ++it) {
        entry.reset(userdefined_.NewEntryWrapper(
            it->first, it->second));
        ::google::protobuf::internal::WireFormatLite::WriteMessage(
            100, *entry, output);
        Utf8Check::Check(&*it);
      }
    }
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Metadata)
}